

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleTextWidget::selection(QAccessibleTextWidget *this)

{
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  
  selection((QAccessibleTextWidget *)
            &this[-1].super_QAccessibleWidget.super_QAccessibleActionInterface,in_ESI,in_RDX,in_RCX)
  ;
  return;
}

Assistant:

void QAccessibleTextWidget::selection(int selectionIndex, int *startOffset, int *endOffset) const
{
    *startOffset = *endOffset = 0;
    QTextCursor cursor = textCursor();

    if (selectionIndex != 0 || !cursor.hasSelection())
        return;

    *startOffset = cursor.selectionStart();
    *endOffset = cursor.selectionEnd();
}